

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode deflate_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  z_stream *z;
  zlib_params *zp;
  size_t nbytes_local;
  char *buf_local;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  writer[1].handler = (content_encoding *)buf;
  *(int *)&writer[1].downstream = (int)nbytes;
  if (*(int *)&writer->params == 3) {
    conn_local._4_4_ = process_trailer(conn,(zlib_params *)&writer->params);
  }
  else {
    conn_local._4_4_ = inflate_stream(conn,writer,ZLIB_INFLATING);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode deflate_unencode_write(struct connectdata *conn,
                                       contenc_writer *writer,
                                       const char *buf, size_t nbytes)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  if(zp->zlib_init == ZLIB_EXTERNAL_TRAILER)
    return process_trailer(conn, zp);

  /* Now uncompress the data */
  return inflate_stream(conn, writer, ZLIB_INFLATING);
}